

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall icu_63::VTimeZone::load(VTimeZone *this,VTZReader *reader,UErrorCode *status)

{
  char16_t srcChar;
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  uint uVar4;
  UVector *pUVar5;
  ulong uVar6;
  UnicodeString *pUVar7;
  undefined4 uVar8;
  undefined1 __nbytes [8];
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *__buf;
  void *extraout_RDX_06;
  code *this_00;
  ConstChar16Ptr *srcChars;
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  ConstChar16Ptr local_a8;
  UnicodeString line;
  
  this_00 = (code *)reader;
  pUVar5 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)reader);
  __buf = extraout_RDX;
  if (pUVar5 != (UVector *)0x0) {
    this_00 = uprv_deleteUObject_63;
    UVector::UVector(pUVar5,uprv_deleteUObject_63,uhash_compareUnicodeString_63,100,status);
    __buf = extraout_RDX_00;
  }
  this->vtzlines = pUVar5;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    line.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
    line.fUnion.fStackFields.fLengthAndFlags = 2;
    bVar2 = false;
    bVar1 = false;
    __nbytes = (undefined1  [8])&line;
    local_b8._8_8_ = status;
LAB_00207384:
    do {
      while( true ) {
        do {
          uVar6 = VTZReader::read(reader,(int)this_00,__buf,(size_t)__nbytes);
          srcChar = (char16_t)uVar6;
          __buf = extraout_RDX_01;
        } while (srcChar == L'\r');
        pUVar7 = (UnicodeString *)(uVar6 & 0xffff);
        if ((int)pUVar7 == 0xffff) {
          if (bVar2) {
            srcChars = &local_a8;
            local_a8.p_ = (char16_t *)ICAL_END_VTIMEZONE;
            UVar3 = UnicodeString::startsWith(&line,srcChars,-1);
            if (UVar3 != '\0') {
              pUVar5 = this->vtzlines;
              pUVar7 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)srcChars);
              if (pUVar7 != (UnicodeString *)0x0) {
                UnicodeString::UnicodeString(pUVar7,&line);
              }
              UVector::addElement(pUVar5,pUVar7,status);
              goto LAB_002075e0;
            }
          }
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            *status = U_INVALID_STATE_ERROR;
          }
          goto LAB_002075e6;
        }
        if (!bVar1) break;
        bVar1 = false;
        if ((srcChar != L'\t') && ((int)pUVar7 != 0x20)) {
          uVar4 = (uint)(ushort)line.fUnion.fStackFields.fLengthAndFlags;
          if (bVar2) {
            uVar8 = line.fUnion.fFields.fLength;
            if (-1 < line.fUnion.fStackFields.fLengthAndFlags) {
              uVar8 = (int)line.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if (0 < (int)uVar8) {
              pUVar5 = this->vtzlines;
              this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
              if ((UnicodeString *)this_00 != (UnicodeString *)0x0) {
                UnicodeString::UnicodeString((UnicodeString *)this_00,&line);
              }
              status = (UErrorCode *)local_b8._8_8_;
              UVector::addElement(pUVar5,this_00,(UErrorCode *)local_b8._8_8_);
              if (U_ZERO_ERROR < *status) goto LAB_002075e6;
              uVar4 = (uint)(ushort)line.fUnion.fStackFields.fLengthAndFlags;
              __buf = extraout_RDX_05;
            }
          }
          __nbytes = (undefined1  [8])(ulong)(uVar4 & 0x1e);
          if ((uVar4 & 1) != 0) {
            __nbytes = (undefined1  [8])0x2;
          }
          line.fUnion.fStackFields.fLengthAndFlags = SUB82(__nbytes,0);
          bVar1 = false;
          if (srcChar != L'\n') {
LAB_00207523:
            bVar1 = false;
            UnicodeString::append(&line,srcChar);
            __buf = extraout_RDX_06;
            this_00 = (code *)pUVar7;
          }
        }
      }
      if (srcChar != L'\n') goto LAB_00207523;
      if (!bVar2) {
        local_c0 = (undefined1  [8])ICAL_BEGIN_VTIMEZONE;
        this_00 = (code *)local_c0;
        UVar3 = UnicodeString::startsWith(&line,(ConstChar16Ptr *)this_00,-1);
        bVar2 = false;
        bVar1 = true;
        __nbytes = local_c0;
        __buf = extraout_RDX_03;
        if (UVar3 != '\0') {
          pUVar5 = this->vtzlines;
          this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
          if ((UnicodeString *)this_00 != (UnicodeString *)0x0) {
            UnicodeString::UnicodeString((UnicodeString *)this_00,&line);
          }
          status = (UErrorCode *)local_b8._8_8_;
          UVector::addElement(pUVar5,this_00,(UErrorCode *)local_b8._8_8_);
          if (U_ZERO_ERROR < *status) goto LAB_002075e6;
          __nbytes = (undefined1  [8])
                     (ulong)((ushort)line.fUnion.fStackFields.fLengthAndFlags & 0x1e);
          if ((line.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
            __nbytes = (undefined1  [8])0x2;
          }
          line.fUnion.fStackFields.fLengthAndFlags = SUB82(__nbytes,0);
          bVar2 = true;
          bVar1 = false;
          __buf = extraout_RDX_04;
        }
        goto LAB_00207384;
      }
      local_b8._0_8_ = ICAL_END_VTIMEZONE;
      this_00 = (code *)local_b8;
      UVar3 = UnicodeString::startsWith(&line,(ConstChar16Ptr *)this_00,-1);
      bVar2 = true;
      bVar1 = true;
      __nbytes = (undefined1  [8])local_b8._0_8_;
      __buf = extraout_RDX_02;
    } while (UVar3 == '\0');
    pUVar5 = this->vtzlines;
    pUVar7 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
    if (pUVar7 != (UnicodeString *)0x0) {
      UnicodeString::UnicodeString(pUVar7,&line);
    }
    UVector::addElement(pUVar5,pUVar7,status);
LAB_002075e0:
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      parse(this,status);
    }
    else {
LAB_002075e6:
      if (this->vtzlines != (UVector *)0x0) {
        (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
      }
      this->vtzlines = (UVector *)0x0;
    }
    UnicodeString::~UnicodeString(&line);
  }
  return;
}

Assistant:

void
VTimeZone::load(VTZReader& reader, UErrorCode& status) {
    vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, DEFAULT_VTIMEZONE_LINES, status);
    if (U_FAILURE(status)) {
        return;
    }
    UBool eol = FALSE;
    UBool start = FALSE;
    UBool success = FALSE;
    UnicodeString line;

    while (TRUE) {
        UChar ch = reader.read();
        if (ch == 0xFFFF) {
            // end of file
            if (start && line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                vtzlines->addElement(new UnicodeString(line), status);
                if (U_FAILURE(status)) {
                    goto cleanupVtzlines;
                }
                success = TRUE;
            }
            break;
        }
        if (ch == 0x000D) {
            // CR, must be followed by LF according to the definition in RFC2445
            continue;
        }
        if (eol) {
            if (ch != 0x0009 && ch != 0x0020) {
                // NOT followed by TAB/SP -> new line
                if (start) {
                    if (line.length() > 0) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                    }
                }
                line.remove();
                if (ch != 0x000A) {
                    line.append(ch);
                }
            }
            eol = FALSE;
        } else {
            if (ch == 0x000A) {
                // LF
                eol = TRUE;
                if (start) {
                    if (line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        success = TRUE;
                        break;
                    }
                } else {
                    if (line.startsWith(ICAL_BEGIN_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        line.remove();
                        start = TRUE;
                        eol = FALSE;
                    }
                }
            } else {
                line.append(ch);
            }
        }
    }
    if (!success) {
        if (U_SUCCESS(status)) {
            status = U_INVALID_STATE_ERROR;
        }
        goto cleanupVtzlines;
    }
    parse(status);
    return;

cleanupVtzlines:
    delete vtzlines;
    vtzlines = NULL;
}